

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

int m2v_LU_det(m2v *LU)

{
  int iVar1;
  long in_RDI;
  m2v *unaff_retaddr;
  int i;
  int det;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 1;
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 4); local_10 = local_10 + 1) {
    iVar1 = m2v_get_el(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_c = local_c * iVar1;
  }
  return local_c;
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}